

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_adjacency.cpp
# Opt level: O2

spv_result_t spvtools::val::ValidateAdjacency(ValidationState_t *_)

{
  Instruction *inst;
  ushort uVar1;
  pointer pIVar2;
  bool bVar3;
  StorageClass SVar4;
  ulong uVar5;
  int iVar6;
  size_t i;
  ulong uVar7;
  char *pcVar8;
  long lVar9;
  DiagnosticStream DStack_208;
  
  iVar6 = 3;
  lVar9 = 0;
  uVar7 = 0;
  do {
    pIVar2 = (_->ordered_instructions_).
             super__Vector_base<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar5 = ((long)(_->ordered_instructions_).
                   super__Vector_base<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar2) / 0x88;
    if (uVar5 <= uVar7) {
      return SPV_SUCCESS;
    }
    inst = (Instruction *)
           ((long)&(pIVar2->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl + lVar9);
    uVar1 = *(ushort *)((long)&(pIVar2->inst_).opcode + lVar9);
    switch(uVar1) {
    case 0xf5:
      bVar3 = iVar6 != 2;
      iVar6 = 2;
      if (bVar3) {
        ValidationState_t::diag(&DStack_208,_,SPV_ERROR_INVALID_DATA,inst);
        std::operator<<((ostream *)&DStack_208,
                        "OpPhi must appear within a non-entry block before all ");
        std::operator<<((ostream *)&DStack_208,"non-OpPhi instructions ");
        pcVar8 = "(except for OpLine, which can be mixed with OpPhi).";
LAB_0017c5ad:
        std::operator<<((ostream *)&DStack_208,pcVar8);
        DiagnosticStream::~DiagnosticStream(&DStack_208);
        return DStack_208.error_;
      }
      break;
    case 0xf6:
      iVar6 = 3;
      if ((uVar7 != uVar5 - 1) && (1 < *(ushort *)((long)&pIVar2[1].inst_.opcode + lVar9) - 0xf9)) {
        ValidationState_t::diag(&DStack_208,_,SPV_ERROR_INVALID_DATA,inst);
        std::operator<<((ostream *)&DStack_208,"OpLoopMerge must immediately precede either an ");
        std::operator<<((ostream *)&DStack_208,"OpBranch or OpBranchConditional instruction. ");
        std::operator<<((ostream *)&DStack_208,
                        "OpLoopMerge must be the second-to-last instruction in ");
        pcVar8 = "its block.";
        goto LAB_0017c5ad;
      }
      break;
    case 0xf7:
      iVar6 = 3;
      if ((uVar7 != uVar5 - 1) &&
         ((*(ushort *)((long)&pIVar2[1].inst_.opcode + lVar9) & 0xfffe) != 0xfa)) {
        ValidationState_t::diag(&DStack_208,_,SPV_ERROR_INVALID_DATA,inst);
        std::operator<<((ostream *)&DStack_208,
                        "OpSelectionMerge must immediately precede either an ");
        std::operator<<((ostream *)&DStack_208,"OpBranchConditional or OpSwitch instruction. ");
        std::operator<<((ostream *)&DStack_208,"OpSelectionMerge must be the second-to-last ");
        pcVar8 = "instruction in its block.";
        goto LAB_0017c5ad;
      }
      break;
    case 0xf8:
      iVar6 = 2 - (uint)(iVar6 == 0);
      break;
    default:
      if (uVar1 - 0x36 < 2) {
        iVar6 = 0;
      }
      else if (uVar1 != 8) {
        if (uVar1 == 0xc) {
LAB_0017c3a8:
          bVar3 = spvExtInstIsDebugInfo
                            (*(spv_ext_inst_type_t *)((long)&(pIVar2->inst_).ext_inst_type + lVar9))
          ;
          if ((!bVar3) || (*(int *)((long)&(pIVar2->inst_).ext_inst_type + lVar9) == 10)) {
LAB_0017c3c2:
            iVar6 = 3;
          }
        }
        else if (uVar1 == 0x3b) {
          SVar4 = Instruction::GetOperandAs<spv::StorageClass>(inst,2);
          if (iVar6 != 1 && SVar4 == Function) {
            ValidationState_t::diag(&DStack_208,_,SPV_ERROR_INVALID_DATA,inst);
            pcVar8 = 
            "All OpVariable instructions in a function must be the first instructions in the first block."
            ;
            goto LAB_0017c5ad;
          }
        }
        else if (uVar1 != 0x13d) {
          if (uVar1 != 0x1142) {
            if (uVar1 == 0x1151) goto LAB_0017c3a8;
            goto LAB_0017c3c2;
          }
          SVar4 = Instruction::GetOperandAs<spv::StorageClass>(inst,2);
          if (iVar6 != 1 && SVar4 == Function) {
            ValidationState_t::diag(&DStack_208,_,SPV_ERROR_INVALID_DATA,inst);
            pcVar8 = 
            "All OpUntypedVariableKHR instructions in a function must be the first instructions in the first block."
            ;
            goto LAB_0017c5ad;
          }
        }
      }
    }
    uVar7 = uVar7 + 1;
    lVar9 = lVar9 + 0x88;
  } while( true );
}

Assistant:

spv_result_t ValidateAdjacency(ValidationState_t& _) {
  const auto& instructions = _.ordered_instructions();
  int adjacency_status = PHI_AND_VAR_INVALID;

  for (size_t i = 0; i < instructions.size(); ++i) {
    const auto& inst = instructions[i];
    switch (inst.opcode()) {
      case spv::Op::OpFunction:
      case spv::Op::OpFunctionParameter:
        adjacency_status = IN_NEW_FUNCTION;
        break;
      case spv::Op::OpLabel:
        adjacency_status =
            adjacency_status == IN_NEW_FUNCTION ? IN_ENTRY_BLOCK : PHI_VALID;
        break;
      case spv::Op::OpExtInst:
      case spv::Op::OpExtInstWithForwardRefsKHR:
        // If it is a debug info instruction, we do not change the status to
        // allow debug info instructions before OpVariable in a function.
        // TODO(https://gitlab.khronos.org/spirv/SPIR-V/issues/533): We need
        // to discuss the location of DebugScope, DebugNoScope, DebugDeclare,
        // and DebugValue.
        // NOTE: This does not apply to the non-semantic vulkan debug info.
        if (!spvExtInstIsDebugInfo(inst.ext_inst_type()) ||
            inst.ext_inst_type() ==
                SPV_EXT_INST_TYPE_NONSEMANTIC_SHADER_DEBUGINFO_100) {
          adjacency_status = PHI_AND_VAR_INVALID;
        }
        break;
      case spv::Op::OpPhi:
        if (adjacency_status != PHI_VALID) {
          return _.diag(SPV_ERROR_INVALID_DATA, &inst)
                 << "OpPhi must appear within a non-entry block before all "
                 << "non-OpPhi instructions "
                 << "(except for OpLine, which can be mixed with OpPhi).";
        }
        break;
      case spv::Op::OpLine:
      case spv::Op::OpNoLine:
        break;
      case spv::Op::OpLoopMerge:
        adjacency_status = PHI_AND_VAR_INVALID;
        if (i != (instructions.size() - 1)) {
          switch (instructions[i + 1].opcode()) {
            case spv::Op::OpBranch:
            case spv::Op::OpBranchConditional:
              break;
            default:
              return _.diag(SPV_ERROR_INVALID_DATA, &inst)
                     << "OpLoopMerge must immediately precede either an "
                     << "OpBranch or OpBranchConditional instruction. "
                     << "OpLoopMerge must be the second-to-last instruction in "
                     << "its block.";
          }
        }
        break;
      case spv::Op::OpSelectionMerge:
        adjacency_status = PHI_AND_VAR_INVALID;
        if (i != (instructions.size() - 1)) {
          switch (instructions[i + 1].opcode()) {
            case spv::Op::OpBranchConditional:
            case spv::Op::OpSwitch:
              break;
            default:
              return _.diag(SPV_ERROR_INVALID_DATA, &inst)
                     << "OpSelectionMerge must immediately precede either an "
                     << "OpBranchConditional or OpSwitch instruction. "
                     << "OpSelectionMerge must be the second-to-last "
                     << "instruction in its block.";
          }
        }
        break;
      case spv::Op::OpVariable:
        if (inst.GetOperandAs<spv::StorageClass>(2) ==
                spv::StorageClass::Function &&
            adjacency_status != IN_ENTRY_BLOCK) {
          return _.diag(SPV_ERROR_INVALID_DATA, &inst)
                 << "All OpVariable instructions in a function must be the "
                    "first instructions in the first block.";
        }
        break;
      case spv::Op::OpUntypedVariableKHR:
        if (inst.GetOperandAs<spv::StorageClass>(2) ==
                spv::StorageClass::Function &&
            adjacency_status != IN_ENTRY_BLOCK) {
          return _.diag(SPV_ERROR_INVALID_DATA, &inst)
                 << "All OpUntypedVariableKHR instructions in a function must "
                    "be the first instructions in the first block.";
        }
        break;
      default:
        adjacency_status = PHI_AND_VAR_INVALID;
        break;
    }
  }

  return SPV_SUCCESS;
}